

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint ** matrix_copy(uint **a,uint rows,uint cols)

{
  uint **ppuVar1;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  uint **b;
  uint cols_local;
  uint rows_local;
  uint **a_local;
  
  ppuVar1 = matrix_new(rows,cols);
  for (local_24 = 0; local_24 < rows; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < cols; local_28 = local_28 + 1) {
      ppuVar1[local_24][local_28] = a[local_24][local_28];
    }
  }
  return ppuVar1;
}

Assistant:

uint32_t **matrix_copy(uint32_t **a, uint32_t rows, uint32_t cols)
{
    uint32_t **b = matrix_new(rows, cols);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < cols; j++)
            b[i][j] = a[i][j];
    return b;
}